

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  byte bVar7;
  uint uVar8;
  runtime_error *prVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  string local_68;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if ((out_type->pointer != false) || (in_type->pointer == true)) {
    if ((out_type->vecsize == 2) || (in_type->vecsize == 2)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"GL_EXT_buffer_reference_uvec2","");
      require_extension_internal(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
LAB_001f928f:
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,out_type,0);
    return __return_storage_ptr__;
  }
  uVar2 = *(uint *)&(out_type->super_IVariant).field_0xc;
  uVar3 = *(uint *)&(in_type->super_IVariant).field_0xc;
  if (uVar2 == uVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    if (uVar2 == 2) {
      __assert_fail("out_type.basetype != SPIRType::Boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x2133,
                    "virtual string spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                   );
    }
    if (uVar3 == 2) {
      __assert_fail("in_type.basetype != SPIRType::Boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x2134,
                    "virtual string spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                   );
    }
    if ((uVar2 - 3 < 8) && (uVar3 - 3 < 8)) {
      bVar7 = 1;
      if (out_type->width == in_type->width) goto LAB_001f928f;
    }
    else {
      bVar7 = 0;
    }
    uVar4 = out_type->width;
    uVar12 = in_type->width;
    uVar5 = in_type->vecsize;
    if ((bool)(uVar5 == 1 & 0xf < uVar12 & bVar7 & uVar4 == 8)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpack8";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar6 = out_type->vecsize;
    if ((bool)(uVar6 == 1 & uVar12 == 8 & bVar7 & uVar4 == 0x10)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "pack16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((bool)(bVar7 & uVar12 == 8 & uVar4 == 0x20 & uVar6 == 1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "pack32";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar12 = uVar2 ^ 8;
    if (uVar12 == 0 && (uVar3 ^ 0xd) == 0) {
      bVar1 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 300 & bVar1) == 1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Float -> Uint bitcast not supported on legacy ESSL.","");
        ::std::runtime_error::runtime_error(prVar9,(string *)&local_68);
        *(undefined ***)prVar9 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar2 < 0x14a) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "floatBitsToUint";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar3 ^ 0xd) == 0 && (uVar2 ^ 7) == 0) {
      bVar1 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 300 & bVar1) == 1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Float -> Int bitcast not supported on legacy ESSL.","");
        ::std::runtime_error::runtime_error(prVar9,(string *)&local_68);
        *(undefined ***)prVar9 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar2 < 0x14a) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "floatBitsToInt";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar14 = uVar3 ^ 8;
    if ((uVar2 ^ 0xd) == 0 && uVar14 == 0) {
      bVar1 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 300 & bVar1) == 1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Uint -> Float bitcast not supported on legacy ESSL.","");
        ::std::runtime_error::runtime_error(prVar9,(string *)&local_68);
        *(undefined ***)prVar9 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar2 < 0x14a) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "uintBitsToFloat";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar2 ^ 0xd) == 0 && (uVar3 ^ 7) == 0) {
      bVar1 = (this->options).es;
      uVar2 = (this->options).version;
      if ((uVar2 < 300 & bVar1) == 1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Int -> Float bitcast not supported on legacy ESSL.","");
        ::std::runtime_error::runtime_error(prVar9,(string *)&local_68);
        *(undefined ***)prVar9 = &PTR__runtime_error_003d4e98;
        __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar1 == false && uVar2 < 0x14a) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"GL_ARB_shader_bit_encoding","");
        require_extension_internal(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "intBitsToFloat";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar2 ^ 9) == 0 && (uVar3 ^ 0xe) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "doubleBitsToInt64";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar15 = uVar2 ^ 10;
    if ((uVar3 ^ 0xe) == 0 && uVar15 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "doubleBitsToUint64";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar2 ^ 0xe) == 0 && (uVar3 ^ 9) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "int64BitsToDouble";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar17 = uVar3 ^ 10;
    if ((uVar2 ^ 0xe) == 0 && uVar17 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "uint64BitsToDouble";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    local_38 = uVar2 ^ 5;
    uVar18 = uVar3 ^ 0xc;
    if (local_38 == 0 && uVar18 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "float16BitsToInt16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    local_3c = uVar2 ^ 6;
    if (local_3c == 0 && uVar18 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "float16BitsToUint16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar10 = uVar2 ^ 0xc;
    local_40 = uVar3 ^ 5;
    if (uVar10 == 0 && local_40 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "int16BitsToFloat16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar8 = uVar3 ^ 6;
    if (uVar10 == 0 && uVar8 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "uint16BitsToFloat16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    local_44 = uVar5 ^ 2;
    local_34 = uVar15 | uVar14 | local_44;
    if (local_34 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packUint2x32";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if (uVar6 == 2 && (uVar12 == 0 && uVar17 == 0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackUint2x32";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    uVar16 = uVar5 ^ 1;
    if ((uVar10 == 0 && uVar14 == 0) && uVar16 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackFloat2x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar18 == 0 && uVar12 == 0) && local_44 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packFloat2x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if (((uVar2 ^ 7) == 0 && local_40 == 0) && local_44 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packInt2x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if (((uVar3 ^ 7) == 0 && local_38 == 0) && uVar16 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackInt2x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar12 == 0 && uVar8 == 0) && local_44 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packUint2x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar14 == 0 && local_3c == 0) && uVar16 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackUint2x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if (((uVar2 ^ 9) == 0 && local_40 == 0) && (uVar5 ^ 4) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packInt4x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((local_38 == 0 && (uVar3 ^ 9) == 0) && uVar16 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "unpackInt4x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    if ((uVar15 == 0 && uVar8 == 0) && (uVar5 ^ 4) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = "packUint4x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((local_3c == 0 && uVar17 == 0) && uVar16 == 0) {
      pcVar13 = "unpackUint4x16";
      pcVar11 = "";
      goto LAB_001f9ab4;
    }
  }
  pcVar11 = "";
  pcVar13 = "";
LAB_001f9ab4:
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar13,pcVar11);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	// OpBitcast can deal with pointers.
	if (out_type.pointer || in_type.pointer)
	{
		if (out_type.vecsize == 2 || in_type.vecsize == 2)
			require_extension_internal("GL_EXT_buffer_reference_uvec2");
		return type_to_glsl(out_type);
	}

	if (out_type.basetype == in_type.basetype)
		return "";

	assert(out_type.basetype != SPIRType::Boolean);
	assert(in_type.basetype != SPIRType::Boolean);

	bool integral_cast = type_is_integral(out_type) && type_is_integral(in_type);
	bool same_size_cast = out_type.width == in_type.width;

	// Trivial bitcast case, casts between integers.
	if (integral_cast && same_size_cast)
		return type_to_glsl(out_type);

	// Catch-all 8-bit arithmetic casts (GL_EXT_shader_explicit_arithmetic_types).
	if (out_type.width == 8 && in_type.width >= 16 && integral_cast && in_type.vecsize == 1)
		return "unpack8";
	else if (in_type.width == 8 && out_type.width == 16 && integral_cast && out_type.vecsize == 1)
		return "pack16";
	else if (in_type.width == 8 && out_type.width == 32 && integral_cast && out_type.vecsize == 1)
		return "pack32";

	// Floating <-> Integer special casts. Just have to enumerate all cases. :(
	// 16-bit, 32-bit and 64-bit floats.
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Uint bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToUint";
	}
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Int bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToInt";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Uint -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "uintBitsToFloat";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Int -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "intBitsToFloat";
	}

	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToInt64";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToUint64";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "int64BitsToDouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "uint64BitsToDouble";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Half)
		return "float16BitsToInt16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
		return "float16BitsToUint16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::Short)
		return "int16BitsToFloat16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
		return "uint16BitsToFloat16";

	// And finally, some even more special purpose casts.
	if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UInt && in_type.vecsize == 2)
		return "packUint2x32";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UInt64 && out_type.vecsize == 2)
		return "unpackUint2x32";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackFloat2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
		return "packFloat2x16";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Short && in_type.vecsize == 2)
		return "packInt2x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int && in_type.vecsize == 1)
		return "unpackInt2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UShort && in_type.vecsize == 2)
		return "packUint2x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackUint2x16";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Short && in_type.vecsize == 4)
		return "packInt4x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int64 && in_type.vecsize == 1)
		return "unpackInt4x16";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UShort && in_type.vecsize == 4)
		return "packUint4x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt64 && in_type.vecsize == 1)
		return "unpackUint4x16";

	return "";
}